

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_RunLength.cc
# Opt level: O3

void __thiscall Pl_RunLength::encode(Pl_RunLength *this,uchar *data,size_t len)

{
  uchar uVar1;
  state_e sVar2;
  uint uVar3;
  Members *pMVar4;
  logic_error *this_00;
  ulong uVar5;
  size_t sVar6;
  
  if (len != 0) {
    pMVar4 = (this->m)._M_t.
             super___uniq_ptr_impl<Pl_RunLength::Members,_std::default_delete<Pl_RunLength::Members>_>
             ._M_t.
             super__Tuple_impl<0UL,_Pl_RunLength::Members_*,_std::default_delete<Pl_RunLength::Members>_>
             .super__Head_base<0UL,_Pl_RunLength::Members_*,_false>._M_head_impl;
    sVar6 = 0;
    do {
      sVar2 = pMVar4->state;
      uVar3 = pMVar4->length;
      uVar5 = (ulong)uVar3;
      if (1 < uVar3 == (sVar2 == st_top)) {
        this_00 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(this_00,"Pl_RunLength::encode: state/length inconsistency");
        __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      uVar1 = data[sVar6];
      if (uVar3 == 0) {
        uVar5 = 0;
        if (sVar2 == st_run) {
LAB_00137bc9:
          flush_encode(this);
          pMVar4 = (this->m)._M_t.
                   super___uniq_ptr_impl<Pl_RunLength::Members,_std::default_delete<Pl_RunLength::Members>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Pl_RunLength::Members_*,_std::default_delete<Pl_RunLength::Members>_>
                   .super__Head_base<0UL,_Pl_RunLength::Members_*,_false>._M_head_impl;
          uVar5 = (ulong)pMVar4->length;
        }
      }
      else {
        if (sVar2 == st_copying) {
          if (uVar1 == pMVar4->buf[uVar3 - 1]) {
            pMVar4->length = uVar3 - 1;
            flush_encode(this);
            ((this->m)._M_t.
             super___uniq_ptr_impl<Pl_RunLength::Members,_std::default_delete<Pl_RunLength::Members>_>
             ._M_t.
             super__Tuple_impl<0UL,_Pl_RunLength::Members_*,_std::default_delete<Pl_RunLength::Members>_>
             .super__Head_base<0UL,_Pl_RunLength::Members_*,_false>._M_head_impl)->buf[0] = uVar1;
            pMVar4 = (this->m)._M_t.
                     super___uniq_ptr_impl<Pl_RunLength::Members,_std::default_delete<Pl_RunLength::Members>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Pl_RunLength::Members_*,_std::default_delete<Pl_RunLength::Members>_>
                     .super__Head_base<0UL,_Pl_RunLength::Members_*,_false>._M_head_impl;
            pMVar4->length = 1;
            uVar5 = 1;
LAB_00137bab:
            pMVar4->state = st_run;
            goto LAB_00137be9;
          }
LAB_00137bb4:
          if (sVar2 == st_run || uVar3 == 0x80) goto LAB_00137bc9;
        }
        else {
          if (0x7f < uVar3) goto LAB_00137bb4;
          if (uVar1 == pMVar4->buf[uVar3 - 1]) goto LAB_00137bab;
          if (sVar2 == st_run) goto LAB_00137bc9;
        }
        pMVar4->state = st_copying;
      }
LAB_00137be9:
      pMVar4->buf[uVar5] = uVar1;
      pMVar4 = (this->m)._M_t.
               super___uniq_ptr_impl<Pl_RunLength::Members,_std::default_delete<Pl_RunLength::Members>_>
               ._M_t.
               super__Tuple_impl<0UL,_Pl_RunLength::Members_*,_std::default_delete<Pl_RunLength::Members>_>
               .super__Head_base<0UL,_Pl_RunLength::Members_*,_false>._M_head_impl;
      pMVar4->length = pMVar4->length + 1;
      sVar6 = sVar6 + 1;
    } while (len != sVar6);
  }
  return;
}

Assistant:

void
Pl_RunLength::encode(unsigned char const* data, size_t len)
{
    for (size_t i = 0; i < len; ++i) {
        if ((m->state == st_top) != (m->length <= 1)) {
            throw std::logic_error("Pl_RunLength::encode: state/length inconsistency");
        }
        unsigned char ch = data[i];
        if ((m->length > 0) && ((m->state == st_copying) || (m->length < 128)) &&
            (ch == m->buf[m->length - 1])) {
            QTC::TC("libtests", "Pl_RunLength: switch to run", (m->length == 128) ? 0 : 1);
            if (m->state == st_copying) {
                --m->length;
                flush_encode();
                m->buf[0] = ch;
                m->length = 1;
            }
            m->state = st_run;
            m->buf[m->length] = ch;
            ++m->length;
        } else {
            if ((m->length == 128) || (m->state == st_run)) {
                flush_encode();
            } else if (m->length > 0) {
                m->state = st_copying;
            }
            m->buf[m->length] = ch;
            ++m->length;
        }
    }
}